

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShell::assertUnsignedLongLongsEqual
          (UtestShell *this,cpputest_ulonglong expected,cpputest_ulonglong actual,char *text,
          char *fileName,size_t lineNumber,TestTerminator *testTerminator)

{
  TestResult *pTVar1;
  cpputest_ulonglong in_RCX;
  char *in_RDX;
  char *in_RSI;
  UtestShell *in_RDI;
  cpputest_ulonglong in_R8;
  UnsignedLongLongsEqualFailure *unaff_retaddr;
  undefined8 in_stack_00000008;
  SimpleString *in_stack_00000010;
  UtestShell *in_stack_ffffffffffffff08;
  SimpleString *in_stack_ffffffffffffff10;
  undefined1 local_98 [112];
  UtestShell *test;
  
  test = in_RDI;
  pTVar1 = getTestResult(in_stack_ffffffffffffff08);
  (*pTVar1->_vptr_TestResult[10])();
  if (in_RSI != in_RDX) {
    SimpleString::SimpleString(in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08);
    UnsignedLongLongsEqualFailure::UnsignedLongLongsEqualFailure
              (unaff_retaddr,test,in_RSI,(size_t)in_RDX,in_RCX,in_R8,in_stack_00000010);
    (*in_RDI->_vptr_UtestShell[0x27])(in_RDI,local_98,in_stack_00000008);
    UnsignedLongLongsEqualFailure::~UnsignedLongLongsEqualFailure
              ((UnsignedLongLongsEqualFailure *)0x183525);
    SimpleString::~SimpleString((SimpleString *)0x18352f);
  }
  return;
}

Assistant:

void UtestShell::assertUnsignedLongLongsEqual(cpputest_ulonglong expected, cpputest_ulonglong actual, const char* text, const char* fileName, size_t lineNumber, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
#ifdef CPPUTEST_USE_LONG_LONG
    if (expected != actual)
        failWith(UnsignedLongLongsEqualFailure(this, fileName, lineNumber, expected, actual, text), testTerminator);
#else
    (void)expected;
    (void)actual;
    failWith(FeatureUnsupportedFailure(this, fileName, lineNumber, "CPPUTEST_USE_LONG_LONG", text), testTerminator);
#endif
}